

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O3

void __thiscall
Rml::FilterDropShadow::ExtendInkOverflow
          (FilterDropShadow *this,Element *element,Rectanglef *scissor_region)

{
  Vector2Type VVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_28;
  float fStack_24;
  
  fVar4 = Element::ResolveLength(element,this->value_sigma);
  fVar5 = Element::ResolveLength(element,this->value_offset_x);
  fVar6 = Element::ResolveLength(element,this->value_offset_y);
  fVar4 = fVar4 * 3.0;
  VVar2 = Math::Max<Rml::Vector2<float>>
                    ((Vector2f)(CONCAT44(fVar6,fVar5) ^ 0x8000000080000000),(Vector2f)0x0);
  VVar3.y = fVar6;
  VVar3.x = fVar5;
  VVar3 = Math::Max<Rml::Vector2<float>>(VVar3,(Vector2f)0x0);
  local_28 = VVar2.x;
  fStack_24 = VVar2.y;
  VVar1 = scissor_region->p1;
  (scissor_region->p0).x = (scissor_region->p0).x - (local_28 + fVar4);
  (scissor_region->p0).y = (scissor_region->p0).y - (fStack_24 + fVar4);
  (scissor_region->p1).x = fVar4 + VVar3.x + VVar1.x;
  (scissor_region->p1).y = fVar4 + VVar3.y + VVar1.y;
  return;
}

Assistant:

void FilterDropShadow::ExtendInkOverflow(Element* element, Rectanglef& scissor_region) const
{
	// Expand the ink overflow area to cover both the native element *and* its offset shadow w/blur.
	const float sigma = element->ResolveLength(value_sigma);
	const Vector2f offset = {
		element->ResolveLength(value_offset_x),
		element->ResolveLength(value_offset_y),
	};

	const float blur_extent = 3.f * sigma;
	scissor_region =
		scissor_region.Extend(Math::Max(-offset, Vector2f(0.f)) + Vector2f(blur_extent), Math::Max(offset, Vector2f(0.f)) + Vector2f(blur_extent));
}